

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrystalMine.hpp
# Opt level: O0

void __thiscall CrystalMine::~CrystalMine(CrystalMine *this)

{
  CrystalMine *this_local;
  
  (this->super_Holding).super_BlackCard.super_Card._vptr_Card =
       (_func_int **)&PTR_effectBonus_0012bc20;
  std::__cxx11::string::~string((string *)&this->name);
  Holding::~Holding(&this->super_Holding);
  return;
}

Assistant:

virtual ~CrystalMine() {}